

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyId __thiscall
Js::ScriptContext::GetOrAddPropertyIdTracked
          (ScriptContext *this,CharacterBuffer<char16_t> *propName)

{
  PropertyId PVar1;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  CharacterBuffer<char16_t> *propName_local;
  ScriptContext *this_local;
  
  local_20 = (PropertyRecord *)0x0;
  propertyRecord = (PropertyRecord *)propName;
  propName_local = (CharacterBuffer<char16_t> *)this;
  ThreadContext::GetOrAddPropertyId(this->threadContext,propName,&local_20);
  TrackPid(this,local_20);
  PVar1 = PropertyRecord::GetPropertyId(local_20);
  return PVar1;
}

Assistant:

PropertyId ScriptContext::GetOrAddPropertyIdTracked(JsUtil::CharacterBuffer<WCHAR> const& propName)
    {
        Js::PropertyRecord const * propertyRecord = nullptr;
        threadContext->GetOrAddPropertyId(propName, &propertyRecord);

        this->TrackPid(propertyRecord);

        return propertyRecord->GetPropertyId();
    }